

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void __thiscall PClassPlayerPawn::DeriveData(PClassPlayerPawn *this,PClass *newclass)

{
  bool bVar1;
  ulong local_28;
  size_t i;
  PClassPlayerPawn *newp;
  PClass *newclass_local;
  PClassPlayerPawn *this_local;
  
  bVar1 = DObject::IsKindOf((DObject *)newclass,RegistrationInfo.MyClass);
  if (!bVar1) {
    __assert_fail("newclass->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                  ,0x222,"virtual void PClassPlayerPawn::DeriveData(PClass *)");
  }
  PClassActor::DeriveData(&this->super_PClassActor,newclass);
  FString::operator=((FString *)&newclass[1].FlatPointers,&this->DisplayName);
  FString::operator=((FString *)&newclass[1].Defaults,&this->SoundClass);
  FString::operator=((FString *)&newclass[1].bRuntimeClass,&this->Face);
  FName::operator=((FName *)&newclass[2].super_PNativeStruct.super_PStruct.super_PNamedType.
                             super_PCompoundType.super_PType.Symbols.Symbols,&this->InvulMode);
  FName::operator=((FName *)((long)&newclass[2].super_PNativeStruct.super_PStruct.super_PNamedType.
                                    super_PCompoundType.super_PType.Symbols.Symbols + 4),
                   &this->HealingRadiusType);
  *(BYTE *)&newclass[2].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
            super_PType.Conversions.Array = this->ColorRangeStart;
  *(BYTE *)((long)&newclass[2].super_PNativeStruct.super_PStruct.super_PNamedType.
                   super_PCompoundType.super_PType.Conversions.Array + 1) = this->ColorRangeEnd;
  TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_>::operator=
            ((TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_> *)
             &newclass[2].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
              super_PType.Conversions.Most,&this->ColorSets);
  for (local_28 = 0; local_28 < 5; local_28 = local_28 + 1) {
    *(double *)
     ((long)&newclass[2].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
             super_PType.Symbols.Symbols + local_28 * 8 + 8) = this->HexenArmor[local_28];
  }
  for (local_28 = 0; local_28 < 10; local_28 = local_28 + 1) {
    FString::operator=((FString *)(&newclass[1].Virtuals.Most + local_28 * 2),this->Slot + local_28)
    ;
  }
  return;
}

Assistant:

void PClassPlayerPawn::DeriveData(PClass *newclass)
{
	assert(newclass->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn)));
	Super::DeriveData(newclass);
	PClassPlayerPawn *newp = static_cast<PClassPlayerPawn *>(newclass);
	size_t i;

	newp->DisplayName = DisplayName;
	newp->SoundClass = SoundClass;
	newp->Face = Face;
	newp->InvulMode = InvulMode;
	newp->HealingRadiusType = HealingRadiusType;
	newp->ColorRangeStart = ColorRangeStart;
	newp->ColorRangeEnd = ColorRangeEnd;
	newp->ColorSets = ColorSets;
	for (i = 0; i < countof(HexenArmor); ++i)
	{
		newp->HexenArmor[i] = HexenArmor[i];
	}
	for (i = 0; i < countof(Slot); ++i)
	{
		newp->Slot[i] = Slot[i];
	}
}